

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

QModelIndexList * __thiscall
QTableView::selectedIndexes(QModelIndexList *__return_storage_ptr__,QTableView *this)

{
  undefined8 *puVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  long lVar5;
  int i;
  ulong uVar6;
  long in_FS_OFFSET;
  QModelIndex local_90;
  Data *local_78;
  QModelIndex *pQStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  QArrayDataPointer<QModelIndex> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QModelIndex *)0x0;
  (__return_storage_ptr__->d).size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (QModelIndex *)0x0;
  local_58.size = 0;
  bVar3 = QPointer::operator_cast_to_bool((QPointer *)(lVar2 + 800));
  if (bVar3) {
    QItemSelectionModel::selectedIndexes();
    QArrayDataPointer<QModelIndex>::operator=(&local_58,(QArrayDataPointer<QModelIndex> *)&local_78)
    ;
    QArrayDataPointer<QModelIndex>::~QArrayDataPointer((QArrayDataPointer<QModelIndex> *)&local_78);
  }
  lVar5 = 0;
  for (uVar6 = 0; uVar6 < (ulong)local_58.size; uVar6 = uVar6 + 1) {
    puVar1 = (undefined8 *)((long)&(local_58.ptr)->r + lVar5);
    local_78 = (Data *)*puVar1;
    pQStack_70 = (QModelIndex *)puVar1[1];
    local_68.ptr = *(QAbstractItemModel **)((long)&((local_58.ptr)->m).ptr + lVar5);
    cVar4 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                   super_QFrame.super_QWidget + 0x2c0))
                      (this,(QModelIndex *)&local_78);
    if (cVar4 == '\0') {
      QModelIndex::parent(&local_90,(QModelIndex *)&local_78);
      cVar4 = ::comparesEqual((QPersistentModelIndex *)(lVar2 + 0x3b8),&local_90);
      if (cVar4 != '\0') {
        QList<QModelIndex>::emplaceBack<QModelIndex_const&>
                  (__return_storage_ptr__,(QModelIndex *)&local_78);
      }
    }
    lVar5 = lVar5 + 0x18;
  }
  QArrayDataPointer<QModelIndex>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndexList QTableView::selectedIndexes() const
{
    Q_D(const QTableView);
    QModelIndexList viewSelected;
    QModelIndexList modelSelected;
    if (d->selectionModel)
        modelSelected = d->selectionModel->selectedIndexes();
    for (int i = 0; i < modelSelected.size(); ++i) {
        QModelIndex index = modelSelected.at(i);
        if (!isIndexHidden(index) && index.parent() == d->root)
            viewSelected.append(index);
    }
    return viewSelected;
}